

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
          (uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *this,char *str_result,
          uint_fast8_t base_rep,bool show_base,bool show_pos,bool is_uppercase,
          unsigned_fast_type field_width,char fill_char_str)

{
  bool bVar1;
  ulong uVar2;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *v;
  unsigned_fast_type uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  char *src;
  string_storage_oct_type str_temp;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> t;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_78;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> tmp;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_48;
  
  iVar4 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar4 == 0x10) {
    detail::fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>::
    fixed_dynamic_array(&t.values,
                        (fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_> *)
                        this);
    tmp.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array._0_1_ = 0;
    detail::fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_> *)&str_temp,0x8008,
               (value_type *)&tmp,(allocator_type *)&local_78);
    bVar1 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero(&t);
    if (bVar1) {
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [0x8006] = '0';
      uVar5 = 0x8006;
    }
    else {
      uVar3 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::
              extract_hex_digits<false,_nullptr>
                        (&t,str_temp.
                            super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            .elems + 0x8007,is_uppercase);
      uVar5 = 0x8007 - uVar3;
    }
    if ((show_base) && (1 < (long)uVar5)) {
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [(int)uVar5 - 1] = !is_uppercase << 5 | 0x58;
      uVar5 = uVar5 - 2;
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [uVar5 & 0xffffffff] = '0';
    }
    if ((show_pos) && (0 < (long)uVar5)) {
      uVar5 = uVar5 - 1;
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [uVar5 & 0xffffffff] = '+';
    }
    uVar2 = (ulong)(str_temp.
                    super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                    elem_count - 1);
    if (field_width != 0) {
      if (uVar2 < field_width) {
        field_width = uVar2;
      }
      while (uVar2 = (ulong)(str_temp.
                             super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elem_count - 1), (long)(uVar2 - field_width) < (long)uVar5) {
        uVar5 = uVar5 - 1;
        str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar5 & 0xffffffff] = fill_char_str;
      }
    }
    str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems[uVar2]
         = '\0';
    src = str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
          + uVar5;
  }
  else if (iVar4 == 10) {
    detail::fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>::
    fixed_dynamic_array(&t.values,
                        (fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_> *)
                        this);
    tmp.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array._0_1_ = 0;
    detail::fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_> *)&str_temp,0x9a26,
               (value_type *)&tmp,(allocator_type *)&local_78);
    bVar1 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero(&t);
    if (bVar1) {
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [0x9a24] = '0';
      uVar5 = 0x9a24;
    }
    else {
      uVar5 = 0x9a25;
      while (bVar1 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero
                               ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
                                &t.values), uVar5 != 0 && !bVar1) {
        detail::fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>::
        fixed_dynamic_array((fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>
                             *)&tmp,&t.values);
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::eval_divide_by_single_limb
                  ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&t.values,10,0,
                   (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)0x0);
        detail::fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>::
        fixed_dynamic_array((fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>
                             *)&local_48,&t.values);
        v = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::mul_by_limb
                      ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_48,
                       10);
        wide_integer::operator-
                  ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_78,&tmp,
                   v);
        uVar5 = uVar5 - 1;
        str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar5 & 0xffffffff] = (char)*local_78.elems + '0';
        util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
        ~dynamic_array(&local_78);
        util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
        ~dynamic_array(&local_48);
        util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
        ~dynamic_array((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        *)&tmp);
      }
    }
    if (show_pos && 0 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [uVar5 & 0xffffffff] = '+';
    }
    uVar2 = (ulong)(str_temp.
                    super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                    elem_count - 1);
    if (field_width != 0) {
      if (uVar2 < field_width) {
        field_width = uVar2;
      }
      while (uVar2 = (ulong)(str_temp.
                             super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elem_count - 1), (long)(uVar2 - field_width) < (long)uVar5) {
        uVar5 = uVar5 - 1;
        str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar5 & 0xffffffff] = fill_char_str;
      }
    }
    str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems[uVar2]
         = '\0';
    src = str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
          + uVar5;
  }
  else {
    if (iVar4 != 8) {
      return false;
    }
    detail::fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>::
    fixed_dynamic_array(&t.values,
                        (fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_> *)
                        this);
    tmp.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array._0_1_ = 0;
    detail::fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              (&str_temp,0xaab3,(value_type *)&tmp,(allocator_type *)&local_78);
    bVar1 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero(&t);
    if (bVar1) {
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [0xaab1] = '0';
      uVar5 = 0xaab1;
    }
    else {
      uVar5 = 0xaab2;
      while (bVar1 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero(&t),
            uVar5 != 0 && !bVar1) {
        uVar5 = uVar5 - 1;
        str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar5 & 0xffffffff] =
             (byte)*t.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems & 7 | 0x30;
        operator>>=((uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *)&t,3);
      }
    }
    if (show_base && 0 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [uVar5 & 0xffffffff] = '0';
    }
    if (show_pos && 0 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [uVar5 & 0xffffffff] = '+';
    }
    uVar2 = (ulong)(str_temp.
                    super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                    elem_count - 1);
    if (field_width != 0) {
      if (uVar2 < field_width) {
        field_width = uVar2;
      }
      while (uVar2 = (ulong)(str_temp.
                             super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elem_count - 1), (long)(uVar2 - field_width) < (long)uVar5) {
        uVar5 = uVar5 - 1;
        str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar5 & 0xffffffff] = fill_char_str;
      }
    }
    str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems[uVar2]
         = '\0';
    src = str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
          + uVar5;
  }
  detail::strcpy_unsafe<char*,char*>(str_result,src);
  util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            (&str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)&t);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }